

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animstate.cpp
# Opt level: O1

void AnimSeqEval(CAnimSequence *pSeq,float Time,CAnimKeyframe *pFrame)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  CAnimKeyframe *pCVar6;
  CAnimKeyframe *pCVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar5 = pSeq->m_NumFrames;
  if ((ulong)uVar5 == 0) {
    fVar12 = 0.0;
    fVar9 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
  }
  else {
    if (uVar5 != 1) {
      fVar12 = 0.0;
      if (1 < (int)uVar5) {
        lVar8 = (ulong)uVar5 - 1;
        pCVar7 = pSeq->m_aFrames;
        do {
          pCVar6 = pCVar7 + 1;
          fVar9 = pCVar7->m_Time;
          if ((fVar9 <= Time) && (Time <= pCVar6->m_Time)) {
            fVar12 = (Time - fVar9) / (pCVar6->m_Time - fVar9);
            goto LAB_0013402e;
          }
          lVar8 = lVar8 + -1;
          pCVar7 = pCVar6;
        } while (lVar8 != 0);
      }
      pCVar7 = (CAnimKeyframe *)0x0;
      pCVar6 = (CAnimKeyframe *)0x0;
LAB_0013402e:
      if (pCVar6 != (CAnimKeyframe *)0x0 && pCVar7 != (CAnimKeyframe *)0x0) {
        pFrame->m_Time = Time;
        uVar1 = pCVar7->m_X;
        uVar3 = pCVar7->m_Y;
        uVar2 = pCVar6->m_X;
        uVar4 = pCVar6->m_Y;
        pFrame->m_X = fVar12 * ((float)uVar2 - (float)uVar1) + (float)uVar1;
        pFrame->m_Y = fVar12 * ((float)uVar4 - (float)uVar3) + (float)uVar3;
        pFrame->m_Angle = (pCVar6->m_Angle - pCVar7->m_Angle) * fVar12 + pCVar7->m_Angle;
      }
      return;
    }
    pCVar7 = pSeq->m_aFrames;
    fVar12 = pCVar7->m_Time;
    fVar9 = pCVar7->m_X;
    fVar10 = pCVar7->m_Y;
    fVar11 = pCVar7->m_Angle;
  }
  pFrame->m_Time = fVar12;
  pFrame->m_X = fVar9;
  pFrame->m_Y = fVar10;
  pFrame->m_Angle = fVar11;
  return;
}

Assistant:

static void AnimSeqEval(CAnimSequence *pSeq, float Time, CAnimKeyframe *pFrame)
{
	if(pSeq->m_NumFrames == 0)
	{
		pFrame->m_Time = 0;
		pFrame->m_X = 0;
		pFrame->m_Y = 0;
		pFrame->m_Angle = 0;
	}
	else if(pSeq->m_NumFrames == 1)
	{
		*pFrame = pSeq->m_aFrames[0];
	}
	else
	{
		//time = maximum(0.0f, minimum(1.0f, time / duration)); // TODO: use clamp
		CAnimKeyframe *pFrame1 = 0;
		CAnimKeyframe *pFrame2 = 0;
		float Blend = 0.0f;

		// TODO: make this smarter.. binary search
		for (int i = 1; i < pSeq->m_NumFrames; i++)
		{
			if (pSeq->m_aFrames[i-1].m_Time <= Time && pSeq->m_aFrames[i].m_Time >= Time)
			{
				pFrame1 = &pSeq->m_aFrames[i-1];
				pFrame2 = &pSeq->m_aFrames[i];
				Blend = (Time - pFrame1->m_Time) / (pFrame2->m_Time - pFrame1->m_Time);
				break;
			}
		}

		if (pFrame1 && pFrame2)
		{
			pFrame->m_Time = Time;
			pFrame->m_X = mix(pFrame1->m_X, pFrame2->m_X, Blend);
			pFrame->m_Y = mix(pFrame1->m_Y, pFrame2->m_Y, Blend);
			pFrame->m_Angle = mix(pFrame1->m_Angle, pFrame2->m_Angle, Blend);
		}
	}
}